

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::checkRemoveMemObj(CLIntercept *this,cl_mem memobj)

{
  cl_uint cVar1;
  cl_mem local_28;
  cl_mem local_20;
  
  local_28 = memobj;
  std::mutex::lock(&this->m_Mutex);
  cVar1 = getRefCount(this,memobj);
  if (cVar1 == 1) {
    local_20 = memobj;
    std::
    _Rb_tree<const_void_*,_std::pair<const_void_*const,_unsigned_int>,_std::_Select1st<std::pair<const_void_*const,_unsigned_int>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
    ::erase(&(this->m_MemAllocNumberMap)._M_t,&local_20);
    std::
    _Rb_tree<_cl_mem_*,_std::pair<_cl_mem_*const,_unsigned_long>,_std::_Select1st<std::pair<_cl_mem_*const,_unsigned_long>_>,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
    ::erase(&(this->m_BufferInfoMap)._M_t,&local_28);
    std::
    _Rb_tree<_cl_mem_*,_std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>,_std::_Select1st<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
    ::erase(&(this->m_ImageInfoMap)._M_t,&local_28);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::checkRemoveMemObj(
    cl_mem memobj )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_uint refCount = getRefCount( memobj );
    if( refCount == 1 )
    {
        m_MemAllocNumberMap.erase( memobj );
        m_BufferInfoMap.erase( memobj );
        m_ImageInfoMap.erase( memobj );
    }
}